

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O2

int picnic_impl_sign(picnic_instance_t *pp,picnic_context_t *context,uint8_t *sig,size_t *siglen)

{
  mzd_local_t *key;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  _Bool _Var5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  ulong uVar13;
  recorded_state_t *state;
  sig_proof_t *prf;
  ulong uVar14;
  uint8_t *puVar15;
  view_t *views;
  view_t *views_00;
  sig_proof_t *psVar16;
  uint8_t *puVar17;
  uint8_t **ppuVar18;
  ulong uVar19;
  byte bVar20;
  long lVar21;
  byte *pbVar22;
  uint j_4;
  uint uVar23;
  ulong uVar24;
  hash_context_x4 *ctx;
  mzd_local_t *pmVar25;
  uint8_t *src;
  mzd_local_t (*pamVar26) [1];
  kdf_shake_x4_t *pkVar27;
  byte bVar28;
  uint r;
  uint uVar29;
  ulong uVar30;
  proof_round_t *prf_round;
  uint j;
  ulong uVar31;
  uint j_1;
  uint uVar32;
  long lVar33;
  uint16_t round_numbers [4];
  in_out_shares_t in_out_shares;
  uint8_t *seeds [4];
  uint8_t public_key [32];
  uint8_t *local_c80;
  uint local_c68;
  uint8_t *local_c20;
  uint8_t *local_c18;
  ushort local_bf8;
  ushort local_bf6;
  ushort local_bf4;
  ushort local_bf2;
  uint8_t *local_bf0;
  recorded_state_t *local_be8;
  uint8_t *local_be0;
  uint local_bd4;
  uint8_t *local_bd0;
  zkbpp_lowmc_implementation_f local_bc8;
  ulong local_bc0;
  size_t *local_bb8;
  long local_bb0;
  ulong local_ba8;
  mzd_local_t local_ba0;
  mzd_local_t local_b80;
  mzd_local_t local_b60;
  uint8_t *local_b40;
  uint8_t *puStack_b38;
  uint8_t *puStack_b30;
  uint8_t *puStack_b28;
  undefined8 uStack_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  uint8_t local_b00 [64];
  uint8_t local_ac0 [64];
  uint8_t local_a80 [96];
  kdf_shake_x4_t local_a20 [3];
  
  uVar6 = pp->num_rounds;
  uVar7 = (pp->lowmc).n;
  bVar1 = pp->input_output_size;
  uVar13 = (ulong)bVar1;
  bVar2 = pp->view_size;
  local_bd0 = sig;
  local_bb8 = siglen;
  local_bc8 = get_zkbpp_lowmc_implementation(&pp->lowmc);
  state = (recorded_state_t *)aligned_alloc(0x20,(ulong)(pp->lowmc).r * 0x20 + 0x20);
  key = context->m_key;
  lowmc_record_state(&pp->lowmc,key,context->m_plaintext,state);
  local_a20[0].sponge.state[0] = '\0';
  local_a20[0].sponge.state[1] = '\0';
  local_a20[0].sponge.state[2] = '\0';
  local_a20[0].sponge.state[3] = '\0';
  local_a20[0].sponge.state[4] = '\0';
  local_a20[0].sponge.state[5] = '\0';
  local_a20[0].sponge.state[6] = '\0';
  local_a20[0].sponge.state[7] = '\0';
  local_a20[0].sponge.state[8] = '\0';
  local_a20[0].sponge.state[9] = '\0';
  local_a20[0].sponge.state[10] = '\0';
  local_a20[0].sponge.state[0xb] = '\0';
  local_a20[0].sponge.state[0xc] = '\0';
  local_a20[0].sponge.state[0xd] = '\0';
  local_a20[0].sponge.state[0xe] = '\0';
  local_a20[0].sponge.state[0xf] = '\0';
  local_a20[0].sponge.state[0x10] = '\0';
  local_a20[0].sponge.state[0x11] = '\0';
  local_a20[0].sponge.state[0x12] = '\0';
  local_a20[0].sponge.state[0x13] = '\0';
  local_a20[0].sponge.state[0x14] = '\0';
  local_a20[0].sponge.state[0x15] = '\0';
  local_a20[0].sponge.state[0x16] = '\0';
  local_a20[0].sponge.state[0x17] = '\0';
  local_a20[0].sponge.state[0x18] = '\0';
  local_a20[0].sponge.state[0x19] = '\0';
  local_a20[0].sponge.state[0x1a] = '\0';
  local_a20[0].sponge.state[0x1b] = '\0';
  local_a20[0].sponge.state[0x1c] = '\0';
  local_a20[0].sponge.state[0x1d] = '\0';
  local_a20[0].sponge.state[0x1e] = '\0';
  local_a20[0].sponge.state[0x1f] = '\0';
  mzd_to_char_array((uint8_t *)local_a20,state[(pp->lowmc).r].state,(ulong)pp->input_output_size);
  iVar12 = picnic_timingsafe_bcmp(context->public_key,local_a20,(ulong)pp->input_output_size);
  if (iVar12 == 0) {
    uVar8 = pp->num_rounds;
    uVar31 = (ulong)uVar8;
    bVar20 = pp->digest_size;
    bVar28 = pp->seed_size;
    bVar3 = pp->input_output_size;
    uVar24 = (ulong)bVar3;
    bVar4 = pp->view_size;
    uVar19 = (ulong)(bVar2 + 7 & 0xfffffff8);
    local_be8 = state;
    prf = (sig_proof_t *)calloc(1,uVar31 * 0x90 + 0x28);
    if (prf != (sig_proof_t *)0x0) {
      uVar29 = (uint)bVar4 + (uint)bVar3;
      uVar32 = bVar4 + 7 & 0xfffffff8;
      _Var5 = context->unruh;
      uVar30 = 0;
      iVar12 = uVar29 * 3 + (uint)bVar3;
      if (_Var5 == false) {
        iVar12 = 0;
      }
      uVar14 = (ulong)(uVar8 + 7 & 0xfffffff8);
      puVar15 = (uint8_t *)
                calloc(1,uVar14 + 0x20 +
                         (ulong)((iVar12 + ((uint)bVar28 + (uint)bVar20 + (uint)bVar3 * 2 + uVar32)
                                           * 3) * (uint)uVar8));
      prf->challenge = puVar15;
      puVar15 = puVar15 + uVar14;
      psVar16 = prf + 1;
      for (; uVar30 != uVar31; uVar30 = uVar30 + 1) {
        for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
          *(uint8_t **)(psVar16->salt + lVar21 * 8) = puVar15;
          puVar15 = puVar15 + bVar28;
        }
        psVar16 = (sig_proof_t *)(psVar16[3].salt + 0x18);
      }
      puVar17 = prf[1].salt + 0x18;
      for (uVar30 = 0; uVar30 != uVar31; uVar30 = uVar30 + 1) {
        for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
          *(uint8_t **)(puVar17 + lVar21 * 8) = puVar15;
          puVar15 = puVar15 + bVar20;
        }
        puVar17 = puVar17 + 0x90;
      }
      puVar17 = prf[2].salt + 8;
      for (uVar30 = 0; uVar30 != uVar31; uVar30 = uVar30 + 1) {
        for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
          *(uint8_t **)(puVar17 + lVar21 * 8) = puVar15;
          puVar15 = puVar15 + uVar24;
        }
        puVar17 = puVar17 + 0x90;
      }
      ppuVar18 = &prf[2].challenge;
      for (uVar30 = 0; uVar30 != uVar31; uVar30 = uVar30 + 1) {
        for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
          ppuVar18[lVar21] = puVar15;
          puVar15 = puVar15 + uVar32;
        }
        ppuVar18 = ppuVar18 + 0x12;
      }
      puVar17 = prf[3].salt + 0x10;
      for (uVar30 = 0; uVar30 != uVar31; uVar30 = uVar30 + 1) {
        for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
          *(uint8_t **)(puVar17 + lVar21 * 8) = puVar15;
          puVar15 = puVar15 + uVar24;
        }
        puVar17 = puVar17 + 0x90;
      }
      if (_Var5 != false) {
        psVar16 = prf + 4;
        for (uVar30 = 0; uVar30 != uVar31; uVar30 = uVar30 + 1) {
          for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
            *(uint8_t **)(psVar16->salt + lVar21 * 8) = puVar15;
            puVar15 = puVar15 + uVar29;
          }
          puVar15 = puVar15 + uVar24;
          psVar16 = (sig_proof_t *)(psVar16[3].salt + 0x18);
        }
      }
    }
    views = (view_t *)aligned_alloc(0x20,(ulong)(pp->lowmc).r * 0x60);
    puVar15 = *(uint8_t **)prf[1].salt;
    prf_round = (proof_round_t *)(prf + 1);
    hash_init((hash_context *)local_a20,(ulong)bVar20);
    hash_update((hash_context *)local_a20,context->private_key,uVar24);
    hash_update((hash_context *)local_a20,context->msg,context->msglen);
    hash_update((hash_context *)local_a20,context->public_key,uVar24);
    hash_update((hash_context *)local_a20,context->plaintext,uVar24);
    hash_update_uint16_le((hash_context *)local_a20,(pp->lowmc).n);
    hash_final((hash_context *)local_a20);
    hash_squeeze((hash_context *)local_a20,puVar15,bVar28 * uVar31 * 3);
    Keccak_HashSqueeze((Keccak_HashInstance *)local_a20,(BitSequence *)prf,0x100);
    views_00 = (view_t *)aligned_alloc(0x20,(ulong)(pp->lowmc).r * 0x60);
    local_bf0 = (uint8_t *)aligned_alloc(8,uVar19 * 0xc);
    local_bd4 = uVar6 & 0xfffffffc;
    uVar32 = 0;
    uVar29 = bVar2 + 7 >> 3;
    local_bb0 = (ulong)uVar29 * 0x18;
    local_ba8 = (ulong)(uVar29 << 4);
    local_be0 = local_a80;
    local_c20 = prf[2].salt + 8;
    local_c18 = prf[3].salt + 0x10;
    local_bc0 = uVar19;
    while( true ) {
      pkVar27 = local_a20;
      bVar20 = (byte)(0xff << ((uint)bVar1 * 8 - (uint)uVar7 & 0x1f));
      if (local_bd4 <= uVar32) break;
      uVar8 = (ushort)uVar32;
      for (lVar21 = -3; uVar19 = local_ba8, lVar33 = local_bb0, lVar21 != 0; lVar21 = lVar21 + 1) {
        local_b40 = prf_round->commitments[lVar21];
        puStack_b38 = prf_round[1].commitments[lVar21];
        puStack_b30 = prf_round[2].commitments[lVar21];
        puStack_b28 = prf_round[3].commitments[lVar21];
        local_bf8 = uVar8;
        local_bf6 = uVar8 | 1;
        local_bf4 = uVar8 | 2;
        local_bf2 = uVar8 | 3;
        kdf_init_x4_from_seed
                  (pkVar27,&local_b40,(uint8_t *)prf,&local_bf8,(short)lVar21 + 3,lVar21 != -1,pp);
        pkVar27 = pkVar27 + 1;
      }
      ctx = local_a20;
      for (lVar21 = 0; lVar21 != 2; lVar21 = lVar21 + 1) {
        hash_squeeze_x4_4(ctx,*(uint8_t **)(local_c20 + lVar21 * 8),
                          *(uint8_t **)(local_c20 + lVar21 * 8 + 0x90),
                          *(uint8_t **)(local_c20 + lVar21 * 8 + 0x120),
                          *(uint8_t **)(local_c20 + lVar21 * 8 + 0x1b0),uVar13);
        ctx = ctx + 1;
      }
      puVar15 = local_bf0;
      for (lVar21 = 0; lVar21 != 0x9a8; lVar21 = lVar21 + 0x338) {
        hash_squeeze_x4_4((hash_context_x4 *)(local_a20[0].sponge.state + lVar21),puVar15,
                          puVar15 + local_bc0,puVar15 + uVar19,puVar15 + lVar33,(ulong)bVar2);
        puVar15 = puVar15 + (uVar29 << 5);
      }
      local_c80 = local_bf0;
      puVar15 = local_c18;
      puVar17 = local_c20;
      for (lVar21 = 0; lVar21 != 4; lVar21 = lVar21 + 1) {
        pmVar25 = &local_ba0;
        for (lVar33 = 0; lVar33 != 2; lVar33 = lVar33 + 1) {
          pbVar22 = (byte *)(*(long *)(puVar17 + lVar33 * 8) + (ulong)(bVar1 - 1));
          *pbVar22 = *pbVar22 & bVar20;
          mzd_from_char_array(pmVar25,*(uint8_t **)(puVar17 + lVar33 * 8),uVar13);
          pmVar25 = pmVar25 + 1;
        }
        mzd_share(&pp->lowmc,&local_b60,&local_ba0,&local_b80,key);
        mzd_to_char_array(prf_round[lVar21].input_shares[2],&local_b60,uVar13);
        src = local_c80;
        for (lVar33 = 0; lVar33 != 3; lVar33 = lVar33 + 1) {
          decompress_view(views_00,pp,src,(uint)lVar33);
          src = src + (uVar29 << 5);
        }
        pamVar26 = (mzd_local_t (*) [1])&local_ba0;
        (*local_bc8)(context->m_plaintext,views,(in_out_shares_t *)pamVar26,views_00,local_be8);
        for (lVar33 = 0; lVar33 != 3; lVar33 = lVar33 + 1) {
          mzd_to_char_array(*(uint8_t **)(puVar15 + lVar33 * 8),*pamVar26,uVar13);
          compress_view(*(uint8_t **)(puVar15 + lVar33 * 8 + -0x18),pp,views,(uint)lVar33);
          pamVar26 = pamVar26 + 1;
        }
        local_c80 = local_c80 + local_bc0;
        puVar17 = puVar17 + 0x90;
        puVar15 = puVar15 + 0x90;
      }
      for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
        uVar19 = (ulong)pp->digest_size;
        hash_init_prefix_x4(local_a20,uVar19,'\x04');
        hash_update_x4_4(local_a20,prf_round->seeds[lVar21],prf_round[1].seeds[lVar21],
                         prf_round[2].seeds[lVar21],prf_round[3].seeds[lVar21],(ulong)pp->seed_size)
        ;
        hash_final_x4(local_a20);
        puVar15 = local_be0;
        hash_squeeze_x4_4(local_a20,(uint8_t *)&local_b40,local_b00,local_ac0,local_be0,uVar19);
        hash_init_prefix_x4(local_a20,uVar19,'\0');
        hash_update_x4_4(local_a20,(uint8_t *)&local_b40,local_b00,local_ac0,puVar15,uVar19);
        hash_update_x4_4(local_a20,prf_round->input_shares[lVar21],prf_round[1].input_shares[lVar21]
                         ,prf_round[2].input_shares[lVar21],prf_round[3].input_shares[lVar21],
                         (ulong)pp->input_output_size);
        hash_update_x4_4(local_a20,prf_round->communicated_bits[lVar21],
                         prf_round[1].communicated_bits[lVar21],
                         prf_round[2].communicated_bits[lVar21],
                         prf_round[3].communicated_bits[lVar21],(ulong)pp->view_size);
        hash_update_x4_4(local_a20,prf_round->output_shares[lVar21],
                         prf_round[1].output_shares[lVar21],prf_round[2].output_shares[lVar21],
                         prf_round[3].output_shares[lVar21],(ulong)pp->input_output_size);
        hash_final_x4(local_a20);
        hash_squeeze_x4_4(local_a20,prf_round->commitments[lVar21],prf_round[1].commitments[lVar21],
                          prf_round[2].commitments[lVar21],prf_round[3].commitments[lVar21],uVar19);
      }
      if (context->unruh == true) {
        for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
          uVar19 = (ulong)pp->digest_size;
          hash_init_prefix_x4(local_a20,uVar19,'\x05');
          hash_update_x4_4(local_a20,prf_round->seeds[lVar21],prf_round[1].seeds[lVar21],
                           prf_round[2].seeds[lVar21],prf_round[3].seeds[lVar21],
                           (ulong)pp->seed_size);
          hash_final_x4(local_a20);
          hash_squeeze_x4_4(local_a20,(uint8_t *)&local_b40,local_b00,local_ac0,local_be0,uVar19);
          hash_init_x4(local_a20,uVar19);
          hash_update_x4_4(local_a20,(uint8_t *)&local_b40,local_b00,local_ac0,local_be0,uVar19);
          if (lVar21 == 2) {
            hash_update_x4_4(local_a20,prf_round->input_shares[2],prf_round[1].input_shares[2],
                             prf_round[2].input_shares[2],prf_round[3].input_shares[2],
                             (ulong)pp->input_output_size);
          }
          hash_update_x4_4(local_a20,prf_round->communicated_bits[lVar21],
                           prf_round[1].communicated_bits[lVar21],
                           prf_round[2].communicated_bits[lVar21],
                           prf_round[3].communicated_bits[lVar21],(ulong)pp->view_size);
          uVar23 = 0;
          if (lVar21 == 2) {
            uVar23 = (uint)pp->input_output_size;
          }
          uVar23 = (uint)pp->view_size + (uint)pp->input_output_size + uVar23;
          hash_update_x4_uint16_le(local_a20,(uint16_t)uVar23);
          hash_final_x4(local_a20);
          hash_squeeze_x4_4(local_a20,prf_round->gs[lVar21],prf_round[1].gs[lVar21],
                            prf_round[2].gs[lVar21],prf_round[3].gs[lVar21],(ulong)uVar23);
        }
      }
      local_c20 = local_c20 + 0x240;
      local_c18 = local_c18 + 0x240;
      uVar32 = uVar32 + 4;
      prf_round = prf_round + 4;
    }
    for (; uVar32 < uVar6; uVar32 = uVar32 + 1) {
      pkVar27 = local_a20;
      for (lVar21 = -3; lVar21 != 0; lVar21 = lVar21 + 1) {
        kdf_init_from_seed((kdf_shake_t *)pkVar27,prf_round->commitments[lVar21],(uint8_t *)prf,
                           (uint16_t)uVar32,(short)lVar21 + 3,lVar21 != -1,pp);
        pkVar27 = (kdf_shake_x4_t *)((pkVar27->sponge).state + 0xe0);
      }
      pmVar25 = &local_ba0;
      pkVar27 = local_a20;
      for (lVar21 = 0; lVar21 != 2; lVar21 = lVar21 + 1) {
        hash_squeeze((hash_context *)pkVar27,*(uint8_t **)(local_c20 + lVar21 * 8),uVar13);
        pbVar22 = (byte *)(*(long *)(local_c20 + lVar21 * 8) + (ulong)(bVar1 - 1));
        *pbVar22 = *pbVar22 & bVar20;
        mzd_from_char_array(pmVar25,*(uint8_t **)(local_c20 + lVar21 * 8),uVar13);
        pkVar27 = (kdf_shake_x4_t *)((pkVar27->sponge).state + 0xe0);
        pmVar25 = pmVar25 + 1;
      }
      mzd_share(&pp->lowmc,&local_b60,&local_ba0,&local_b80,key);
      mzd_to_char_array(prf_round->input_shares[2],&local_b60,uVar13);
      pkVar27 = local_a20;
      for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
        hash_squeeze((hash_context *)pkVar27,(uint8_t *)&local_b40,(ulong)bVar2);
        decompress_view(views_00,pp,(uint8_t *)&local_b40,(uint)lVar21);
        pkVar27 = (kdf_shake_x4_t *)((pkVar27->sponge).state + 0xe0);
      }
      pamVar26 = (mzd_local_t (*) [1])&local_ba0;
      (*local_bc8)(context->m_plaintext,views,(in_out_shares_t *)pamVar26,views_00,local_be8);
      for (lVar21 = 0; lVar21 != 3; lVar21 = lVar21 + 1) {
        mzd_to_char_array(*(uint8_t **)(local_c18 + lVar21 * 8),*pamVar26,uVar13);
        compress_view(*(uint8_t **)(local_c18 + lVar21 * 8 + -0x18),pp,views,(uint)lVar21);
        hash_commitment(pp,prf_round,(uint)lVar21);
        pamVar26 = pamVar26 + 1;
      }
      if (context->unruh == true) {
        for (uVar29 = 0; uVar29 != 3; uVar29 = uVar29 + 1) {
          unruh_G(pp,prf_round,uVar29,uVar29 == 2);
        }
      }
      local_c20 = local_c20 + 0x90;
      local_c18 = local_c18 + 0x90;
      prf_round = prf_round + 1;
    }
    uVar6 = pp->num_rounds;
    hash_init_prefix((hash_context *)local_a20,(ulong)pp->digest_size,'\x01');
    iVar12 = (uint)uVar6 + (uint)uVar6 * 2;
    hash_update((hash_context *)local_a20,*(uint8_t **)(prf[3].salt + 0x10),
                (ulong)((uint)pp->input_output_size * iVar12));
    hash_update((hash_context *)local_a20,*(uint8_t **)(prf[1].salt + 0x18),
                (ulong)((uint)pp->digest_size * iVar12));
    if (context->unruh == true) {
      local_c68 = (uint)uVar6;
      hash_update((hash_context *)local_a20,*(uint8_t **)prf[4].salt,
                  (ulong)(((uint)pp->view_size + (uint)pp->view_size * 2 +
                          (uint)pp->input_output_size * 4) * local_c68));
    }
    H3_public_key_message((hash_context *)local_a20,pp,(uint8_t *)prf,context);
    hash_final((hash_context *)local_a20);
    local_b40 = (uint8_t *)0x0;
    puStack_b38 = (uint8_t *)0x0;
    puStack_b30 = (uint8_t *)0x0;
    puStack_b28 = (uint8_t *)0x0;
    uStack_b20 = 0;
    uStack_b18 = 0;
    uStack_b10 = 0;
    uStack_b08 = 0;
    hash_squeeze((hash_context *)local_a20,(uint8_t *)&local_b40,(ulong)pp->digest_size);
    H3_compute(pp,(uint8_t *)&local_b40,prf->challenge);
    uVar13 = (ulong)pp->seed_size;
    uVar6 = pp->num_rounds;
    bVar1 = pp->input_output_size;
    pbVar22 = prf->challenge;
    bVar2 = pp->digest_size;
    bVar20 = pp->view_size;
    for (uVar19 = 0; (uint)uVar6 * 2 != uVar19; uVar19 = uVar19 + 2) {
      bVar28 = *pbVar22;
      uVar29 = (uint)bVar28 + (uint)bVar28 & 2 | (uint)(bVar28 >> 1);
      if ((uVar19 & 6) == 0) {
        bVar28 = (char)uVar29 << 6;
      }
      else {
        bVar28 = (byte)(uVar29 << ((byte)(6 - ((byte)uVar19 & 6)) & 0x1f)) | local_bd0[uVar19 >> 3];
      }
      local_bd0[uVar19 >> 3] = bVar28;
      pbVar22 = pbVar22 + 1;
    }
    uVar9 = *(undefined8 *)(prf->salt + 8);
    uVar10 = *(undefined8 *)(prf->salt + 0x10);
    uVar11 = *(undefined8 *)(prf->salt + 0x18);
    puVar17 = prf[2].salt + 0x18;
    puVar15 = local_bd0 + (uVar19 + 7 >> 3 & 0xffffffff) + 0x20;
    *(undefined8 *)(puVar15 + -0x20) = *(undefined8 *)prf->salt;
    *(undefined8 *)(puVar15 + -0x18) = uVar9;
    *(undefined8 *)(puVar15 + -0x10) = uVar10;
    *(undefined8 *)(puVar15 + -8) = uVar11;
    for (uVar19 = 0; uVar6 != uVar19; uVar19 = uVar19 + 1) {
      bVar28 = prf->challenge[uVar19];
      uVar31 = (ulong)bVar28;
      uVar24 = (ulong)((ushort)(bVar28 + 2) % 3);
      memcpy(puVar15,*(void **)(puVar17 + uVar24 * 8 + -0x28),(ulong)bVar2);
      puVar15 = puVar15 + bVar2;
      if (*(void **)(puVar17 + uVar24 * 8 + 0x38) != (void *)0x0) {
        local_c80._0_4_ = (uint)bVar1;
        uVar29 = 0;
        if (uVar31 == 0) {
          uVar29 = (uint)local_c80;
        }
        uVar30 = (ulong)(uVar29 + (uint)bVar1 + (uint)bVar20);
        memcpy(puVar15,*(void **)(puVar17 + uVar24 * 8 + 0x38),uVar30);
        puVar15 = puVar15 + uVar30;
      }
      uVar24 = (ulong)(ushort)((bVar28 + 1) % 3);
      memcpy(puVar15,*(void **)(puVar17 + uVar24 * 8 + 8),(ulong)bVar20);
      puVar15 = puVar15 + bVar20;
      memcpy(puVar15,*(void **)(puVar17 + uVar31 * 8 + -0x40),uVar13);
      memcpy(puVar15 + uVar13,*(void **)(puVar17 + uVar24 * 8 + -0x40),uVar13);
      puVar15 = puVar15 + uVar13 + uVar13;
      if (uVar31 != 0) {
        memcpy(puVar15,*(void **)puVar17,(ulong)bVar1);
        puVar15 = puVar15 + bVar1;
      }
      puVar17 = puVar17 + 0x90;
    }
    *local_bb8 = (long)puVar15 - (long)local_bd0;
    free(local_bf0);
    free(views_00);
    free(views);
    proof_free(prf);
    free(local_be8);
    iVar12 = 0;
  }
  else {
    free(state);
    iVar12 = -2;
  }
  return iVar12;
}

Assistant:

int picnic_impl_sign(const picnic_instance_t* pp, const picnic_context_t* context, uint8_t* sig,
                     size_t* siglen) {
  const unsigned int num_rounds        = pp->num_rounds;
  const unsigned int input_output_size = pp->input_output_size;
  const unsigned int view_size         = pp->view_size;
  const unsigned int aview_size        = ALIGNU64T(view_size);
  const unsigned int diff              = input_output_size * 8 - pp->lowmc.n;

  const zkbpp_lowmc_implementation_f lowmc_impl = get_zkbpp_lowmc_implementation(&pp->lowmc);

  // Perform LowMC evaluation and record state before AND gates
  recorded_state_t* recorded_state =
      picnic_aligned_alloc(32, sizeof(recorded_state_t) * (pp->lowmc.r + 1));
  lowmc_record_state(&pp->lowmc, context->m_key, context->m_plaintext, recorded_state);
  // Validate public key
  {
    uint8_t public_key[MAX_LOWMC_BLOCK_SIZE] = {0};
    mzd_to_char_array(public_key, recorded_state[pp->lowmc.r].state, pp->input_output_size);
    const int check =
        picnic_timingsafe_bcmp(context->public_key, &public_key, pp->input_output_size);
    // check encodes the consistency of the embedded public key with the secret key and is safe to
    // leak.
    picnic_declassify(&check, sizeof(check));
    if (check) {
      picnic_aligned_free(recorded_state);
      return -2;
    }
  }

  sig_proof_t* prf = proof_new(pp, context);
  view_t* views    = picnic_aligned_alloc(32, sizeof(view_t) * pp->lowmc.r);

  in_out_shares_t in_out_shares;

  // Generate seeds
  generate_seeds(pp, context, prf->round[0].seeds[0], prf->salt);

  rvec_t* rvec =
      picnic_aligned_alloc(32, sizeof(rvec_t) * pp->lowmc.r); // random tapes for AND-gates
  uint8_t* tape_bytes_x4 = picnic_aligned_alloc(sizeof(uint64_t), SC_PROOF * 4 * aview_size);

  proof_round_t* round = prf->round;
  unsigned int i       = 0;
  for (; i < (num_rounds / 4) * 4; i += 4, round += 4) {
    // use 4 parallel instances of keccak for speedup
    {
      kdf_shake_x4_t kdfs[SC_PROOF];
      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        const bool include_input_size   = (j != SC_PROOF - 1);
        const uint8_t* seeds[4]         = {round[0].seeds[j], round[1].seeds[j], round[2].seeds[j],
                                           round[3].seeds[j]};
        const uint16_t round_numbers[4] = {i, i + 1, i + 2, i + 3};
        kdf_init_x4_from_seed(&kdfs[j], seeds, prf->salt, round_numbers, j, include_input_size, pp);
      }

      // compute sharing
      for (unsigned int j = 0; j < SC_PROOF - 1; ++j) {
        kdf_shake_x4_get_randomness_4(&kdfs[j], round[0].input_shares[j], round[1].input_shares[j],
                                      round[2].input_shares[j], round[3].input_shares[j],
                                      input_output_size);
      }
      // compute random tapes
      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        kdf_shake_x4_get_randomness_4(&kdfs[j], &tape_bytes_x4[(j * 4 + 0) * aview_size],
                                      &tape_bytes_x4[(j * 4 + 1) * aview_size],
                                      &tape_bytes_x4[(j * 4 + 2) * aview_size],
                                      &tape_bytes_x4[(j * 4 + 3) * aview_size], view_size);
        kdf_shake_x4_clear(&kdfs[j]);
      }
    }

    for (unsigned int round_offset = 0; round_offset < 4; round_offset++) {
      for (unsigned int j = 0; j < SC_PROOF - 1; ++j) {
        clear_padding_bits(&round[round_offset].input_shares[j][input_output_size - 1], diff);
        mzd_from_char_array(in_out_shares.s[j], round[round_offset].input_shares[j],
                            input_output_size);
      }
      mzd_share(&pp->lowmc, in_out_shares.s[2], in_out_shares.s[0], in_out_shares.s[1],
                context->m_key);
      mzd_to_char_array(round[round_offset].input_shares[SC_PROOF - 1],
                        in_out_shares.s[SC_PROOF - 1], input_output_size);

      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        decompress_random_tape(rvec, pp, &tape_bytes_x4[(j * 4 + round_offset) * aview_size], j);
      }

      // perform ZKB++ LowMC evaluation
      lowmc_impl(context->m_plaintext, views, &in_out_shares, rvec, recorded_state);

      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        mzd_to_char_array(round[round_offset].output_shares[j], in_out_shares.s[j],
                          input_output_size);
        compress_view(round[round_offset].communicated_bits[j], pp, views, j);
      }
    }

    // commitments
    for (unsigned int j = 0; j < SC_PROOF; ++j) {
      hash_commitment_x4(pp, round, j);
    }

#if defined(WITH_UNRUH)
    // unruh G
    if (context->unruh) {
      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        unruh_G_x4(pp, round, j, j == SC_PROOF - 1);
      }
    }
#endif
  }
  for (; i < num_rounds; ++i, ++round) {
    {
      kdf_shake_t kdfs[SC_PROOF];
      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        const bool include_input_size = (j != SC_PROOF - 1);
        kdf_init_from_seed(&kdfs[j], round->seeds[j], prf->salt, i, j, include_input_size, pp);
      }

      // compute sharing
      for (unsigned int j = 0; j < SC_PROOF - 1; ++j) {
        kdf_shake_get_randomness(&kdfs[j], round->input_shares[j], input_output_size);
        clear_padding_bits(&round->input_shares[j][input_output_size - 1], diff);
        mzd_from_char_array(in_out_shares.s[j], round->input_shares[j], input_output_size);
      }
      mzd_share(&pp->lowmc, in_out_shares.s[2], in_out_shares.s[0], in_out_shares.s[1],
                context->m_key);
      mzd_to_char_array(round->input_shares[SC_PROOF - 1], in_out_shares.s[SC_PROOF - 1],
                        input_output_size);

      // compute random tapes
      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        assert(view_size <= MAX_VIEW_SIZE);
        uint8_t tape_bytes[MAX_VIEW_SIZE];
        kdf_shake_get_randomness(&kdfs[j], tape_bytes, view_size);
        decompress_random_tape(rvec, pp, tape_bytes, j);
      }

      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        kdf_shake_clear(&kdfs[j]);
      }
    }

    // perform ZKB++ LowMC evaluation
    lowmc_impl(context->m_plaintext, views, &in_out_shares, rvec, recorded_state);

    // commitments
    for (unsigned int j = 0; j < SC_PROOF; ++j) {
      mzd_to_char_array(round->output_shares[j], in_out_shares.s[j], input_output_size);
      compress_view(round->communicated_bits[j], pp, views, j);
      hash_commitment(pp, round, j);
    }

#if defined(WITH_UNRUH)
    // unruh G
    if (context->unruh) {
      for (unsigned int j = 0; j < SC_PROOF; ++j) {
        unruh_G(pp, round, j, j == SC_PROOF - 1);
      }
    }
#endif
  }
  H3(pp, prf, context);

  const int ret = sig_proof_to_char_array(pp, prf, sig, siglen);

  // clean up
  picnic_aligned_free(tape_bytes_x4);
  picnic_aligned_free(rvec);
  picnic_aligned_free(views);
  proof_free(prf);
  picnic_aligned_free(recorded_state);
  return ret;
}